

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_features.pb.cc
# Opt level: O0

void pb::CppFeatures::SharedDtor(MessageLite *self)

{
  Arena *pAVar1;
  LogMessage *pLVar2;
  LogMessage local_30;
  Voidify local_19;
  MessageLite *local_18;
  CppFeatures *this_;
  MessageLite *self_local;
  
  local_18 = self;
  this_ = (CppFeatures *)self;
  google::protobuf::internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>
            (&self->_internal_metadata_);
  pAVar1 = google::protobuf::MessageLite::GetArena(local_18);
  if (pAVar1 == (Arena *)0x0) {
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/cpp_features.pb.cc"
             ,0xb4,"this_.GetArena() == nullptr");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
}

Assistant:

inline void CppFeatures::SharedDtor(MessageLite& self) {
  CppFeatures& this_ = static_cast<CppFeatures&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  this_._impl_.~Impl_();
}